

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  byte bVar1;
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  Type TVar8;
  int iVar9;
  TestEventListeners *this_00;
  TestEventListener *pTVar10;
  TimeInMillis TVar11;
  Random *this_01;
  UnitTestImpl *this_02;
  char *__s;
  undefined8 uVar12;
  TestSuite *pTVar13;
  bool local_c5;
  uint local_c4;
  undefined1 local_b0 [7];
  bool delete_environment_on_teardown;
  undefined1 local_a8 [16];
  int test_index_1;
  int j_1;
  int test_index;
  allocator<char> local_81;
  string local_80 [32];
  string *local_60;
  string *result;
  TestPartResult *test_part_result;
  TestResult *pTStack_48;
  int j;
  TestResult *test_result;
  Timer timer;
  int i;
  bool recreate_environments_when_repeating;
  bool gtest_repeat_forever;
  int repeat;
  TestEventListener *repeater;
  bool failed;
  bool has_tests_to_run;
  bool should_shard;
  bool in_subprocess_for_death_test;
  bool gtest_is_initialized_before_run_all_tests;
  UnitTestImpl *this_local;
  
  bVar3 = GTestIsInitialized();
  if ((g_help_flag & 1) == 0) {
    PostFlagParsingInit(this);
    if (((FLAGS_gtest_fail_if_no_test_linked & 1) == 0) ||
       (iVar6 = total_test_count(this), iVar6 != 0)) {
      WriteToShardStatusFileIfNeeded();
      bVar4 = std::operator!=(&this->internal_run_death_test_flag_,(nullptr_t)0x0);
      bVar5 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",bVar4);
      iVar6 = FilterTests(this,(uint)!bVar5);
      if ((FLAGS_gtest_list_tests & 1) == 0) {
        iVar7 = GetRandomSeedFromFlag(FLAGS_gtest_random_seed);
        this->random_seed_ = iVar7;
        bVar1 = 0;
        this_00 = listeners(this);
        pTVar10 = TestEventListeners::repeater(this_00);
        TVar11 = GetTimeInMillis();
        this->start_timestamp_ = TVar11;
        (*pTVar10->_vptr_TestEventListener[2])(pTVar10,this->parent_);
        if (bVar4) {
          local_c4 = 1;
        }
        else {
          local_c4 = FLAGS_gtest_repeat;
        }
        local_c5 = (FLAGS_gtest_recreate_environments_when_repeating & 1) != 0 || (int)local_c4 < 0;
        timer.start_.__d.__r._4_4_ = 0;
LAB_0016f653:
        if ((int)local_c4 < 0 || timer.start_.__d.__r._4_4_ != local_c4) {
          ClearNonAdHocTestResult(this);
          Timer::Timer((Timer *)&test_result);
          if ((0 < iVar6) && ((FLAGS_gtest_shuffle & 1) != 0)) {
            this_01 = (Random *)random(this);
            Random::Reseed(this_01,this->random_seed_);
            ShuffleTests(this);
          }
          (*pTVar10->_vptr_TestEventListener[3])
                    (pTVar10,this->parent_,(ulong)timer.start_.__d.__r._4_4_);
          if (0 < iVar6) {
            if ((timer.start_.__d.__r._4_4_ == 0) || (local_c5)) {
              (*pTVar10->_vptr_TestEventListener[4])(pTVar10,this->parent_);
              ForEach<std::vector<testing::Environment*,std::allocator<testing::Environment*>>,void(*)(testing::Environment*)>
                        (&this->environments_,SetUpEnvironment);
              (*pTVar10->_vptr_TestEventListener[5])(pTVar10,this->parent_);
            }
            bVar4 = Test::IsSkipped();
            if (bVar4) {
              this_02 = GetUnitTestImpl();
              pTStack_48 = current_test_result(this_02);
              for (test_part_result._4_4_ = 0; iVar7 = test_part_result._4_4_,
                  iVar9 = TestResult::total_part_count(pTStack_48), iVar7 < iVar9;
                  test_part_result._4_4_ = test_part_result._4_4_ + 1) {
                result = (string *)TestResult::GetTestPartResult(pTStack_48,test_part_result._4_4_);
                TVar8 = TestPartResult::type((TestPartResult *)result);
                if (TVar8 == kSkip) {
                  __s = TestPartResult::message((TestPartResult *)result);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>(local_80,__s,&local_81);
                  std::allocator<char>::~allocator(&local_81);
                  local_60 = local_80;
                  uVar12 = std::__cxx11::string::c_str();
                  printf("%s\n",uVar12);
                  std::__cxx11::string::~string(local_80);
                }
              }
              fflush(_stdout);
            }
            else {
              bVar4 = Test::HasFatalFailure();
              if (bVar4) {
                bVar4 = Test::HasFatalFailure();
                if (bVar4) {
                  for (local_a8._8_4_ = 0; uVar2 = local_a8._8_4_,
                      iVar7 = total_test_suite_count(this), (int)uVar2 < iVar7;
                      local_a8._8_4_ = local_a8._8_4_ + 1) {
                    pTVar13 = GetMutableSuiteCase(this,local_a8._8_4_);
                    TestSuite::Skip(pTVar13);
                  }
                }
              }
              else {
                for (test_index_1 = 0; iVar7 = test_index_1, iVar9 = total_test_suite_count(this),
                    iVar7 < iVar9; test_index_1 = test_index_1 + 1) {
                  pTVar13 = GetMutableSuiteCase(this,test_index_1);
                  TestSuite::Run(pTVar13);
                  if ((FLAGS_gtest_fail_fast & 1) != 0) {
                    pTVar13 = GetMutableSuiteCase(this,test_index_1);
                    bVar4 = TestSuite::Failed(pTVar13);
                    iVar7 = test_index_1;
                    if (bVar4) goto LAB_0016f916;
                  }
                }
              }
            }
            goto LAB_0016f9e9;
          }
          goto LAB_0016fa76;
        }
        (*pTVar10->_vptr_TestEventListener[0x11])(pTVar10,this->parent_);
        ForEach<std::vector<testing::Environment*,std::allocator<testing::Environment*>>,void(*)(testing::Environment*)>
                  (&this->environments_,Delete<testing::Environment>);
        std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::clear
                  (&this->environments_);
        if (!bVar3) {
          ColoredPrintf(kRed,
                        "\nIMPORTANT NOTICE - DO NOT IGNORE:\nThis test program did NOT call testing::InitGoogleTest() before calling RUN_ALL_TESTS(). This is INVALID. Soon Google Test will start to enforce the valid usage. Please fix it ASAP, or IT WILL START TO FAIL.\n"
                       );
        }
        this_local._7_1_ = (bool)(bVar1 ^ 1);
      }
      else {
        ListTestsMatchingFilter(this);
        this_local._7_1_ = true;
      }
    }
    else {
      ColoredPrintf(kRed,
                    "This test program does NOT link in any test case. This is INVALID. Please make sure to link in at least one test case.\n"
                   );
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
LAB_0016f916:
  while( true ) {
    local_a8._12_4_ = iVar7 + 1;
    uVar2 = local_a8._12_4_;
    iVar7 = total_test_suite_count(this);
    if (iVar7 <= (int)uVar2) break;
    pTVar13 = GetMutableSuiteCase(this,local_a8._12_4_);
    TestSuite::Skip(pTVar13);
    iVar7 = local_a8._12_4_;
  }
LAB_0016f9e9:
  if ((timer.start_.__d.__r._4_4_ == local_c4 - 1) || (local_c5)) {
    (*pTVar10->_vptr_TestEventListener[0xe])(pTVar10,this->parent_);
    std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::rbegin
              ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)local_a8);
    std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::rend
              ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)local_b0);
    __std__for_each<std::reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>,void(*)(testing::Environment*)>_std__reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>_std__reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>_void____testing__Environment____
              ((reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>_>
                *)local_a8,
               (reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>_>
                *)local_b0,TearDownEnvironment);
    (*pTVar10->_vptr_TestEventListener[0xf])(pTVar10,this->parent_);
  }
LAB_0016fa76:
  TVar11 = Timer::Elapsed((Timer *)&test_result);
  this->elapsed_time_ = TVar11;
  (*pTVar10->_vptr_TestEventListener[0x10])(pTVar10,this->parent_,(ulong)timer.start_.__d.__r._4_4_)
  ;
  bVar4 = Passed(this);
  if (!bVar4) {
    bVar1 = 1;
  }
  UnshuffleTests(this);
  if ((FLAGS_gtest_shuffle & 1) != 0) {
    iVar7 = GetNextRandomSeed(this->random_seed_);
    this->random_seed_ = iVar7;
  }
  timer.start_.__d.__r._4_4_ = timer.start_.__d.__r._4_4_ + 1;
  goto LAB_0016f653;
}

Assistant:

bool UnitTestImpl::RunAllTests() {
  // True if and only if Google Test is initialized before RUN_ALL_TESTS() is
  // called.
  const bool gtest_is_initialized_before_run_all_tests = GTestIsInitialized();

  // Do not run any test if the --help flag was specified.
  if (g_help_flag) return true;

  // Repeats the call to the post-flag parsing initialization in case the
  // user didn't call InitGoogleTest.
  PostFlagParsingInit();

  if (GTEST_FLAG_GET(fail_if_no_test_linked) && total_test_count() == 0) {
    ColoredPrintf(
        GTestColor::kRed,
        "This test program does NOT link in any test case. This is INVALID. "
        "Please make sure to link in at least one test case.\n");
    return false;
  }

#if GTEST_HAS_FILE_SYSTEM
  // Even if sharding is not on, test runners may want to use the
  // GTEST_SHARD_STATUS_FILE to query whether the test supports the sharding
  // protocol.
  internal::WriteToShardStatusFileIfNeeded();
#endif  // GTEST_HAS_FILE_SYSTEM

  // True if and only if we are in a subprocess for running a thread-safe-style
  // death test.
  bool in_subprocess_for_death_test = false;

#ifdef GTEST_HAS_DEATH_TEST
  in_subprocess_for_death_test = (internal_run_death_test_flag_ != nullptr);
#if defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
  if (in_subprocess_for_death_test) {
    GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_();
  }
#endif  // defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
#endif  // GTEST_HAS_DEATH_TEST

  const bool should_shard = ShouldShard(kTestTotalShards, kTestShardIndex,
                                        in_subprocess_for_death_test);

  // Compares the full test names with the filter to decide which
  // tests to run.
  const bool has_tests_to_run =
      FilterTests(should_shard ? HONOR_SHARDING_PROTOCOL
                               : IGNORE_SHARDING_PROTOCOL) > 0;

  // Lists the tests and exits if the --gtest_list_tests flag was specified.
  if (GTEST_FLAG_GET(list_tests)) {
    // This must be called *after* FilterTests() has been called.
    ListTestsMatchingFilter();
    return true;
  }

  random_seed_ = GetRandomSeedFromFlag(GTEST_FLAG_GET(random_seed));

  // True if and only if at least one test has failed.
  bool failed = false;

  TestEventListener* repeater = listeners()->repeater();

  start_timestamp_ = GetTimeInMillis();
  repeater->OnTestProgramStart(*parent_);

  // How many times to repeat the tests?  We don't want to repeat them
  // when we are inside the subprocess of a death test.
  const int repeat = in_subprocess_for_death_test ? 1 : GTEST_FLAG_GET(repeat);

  // Repeats forever if the repeat count is negative.
  const bool gtest_repeat_forever = repeat < 0;

  // Should test environments be set up and torn down for each repeat, or only
  // set up on the first and torn down on the last iteration? If there is no
  // "last" iteration because the tests will repeat forever, always recreate the
  // environments to avoid leaks in case one of the environments is using
  // resources that are external to this process. Without this check there would
  // be no way to clean up those external resources automatically.
  const bool recreate_environments_when_repeating =
      GTEST_FLAG_GET(recreate_environments_when_repeating) ||
      gtest_repeat_forever;

  for (int i = 0; gtest_repeat_forever || i != repeat; i++) {
    // We want to preserve failures generated by ad-hoc test
    // assertions executed before RUN_ALL_TESTS().
    ClearNonAdHocTestResult();

    Timer timer;

    // Shuffles test suites and tests if requested.
    if (has_tests_to_run && GTEST_FLAG_GET(shuffle)) {
      random()->Reseed(static_cast<uint32_t>(random_seed_));
      // This should be done before calling OnTestIterationStart(),
      // such that a test event listener can see the actual test order
      // in the event.
      ShuffleTests();
    }

    // Tells the unit test event listeners that the tests are about to start.
    repeater->OnTestIterationStart(*parent_, i);

    // Runs each test suite if there is at least one test to run.
    if (has_tests_to_run) {
      // Sets up all environments beforehand. If test environments aren't
      // recreated for each iteration, only do so on the first iteration.
      if (i == 0 || recreate_environments_when_repeating) {
        repeater->OnEnvironmentsSetUpStart(*parent_);
        ForEach(environments_, SetUpEnvironment);
        repeater->OnEnvironmentsSetUpEnd(*parent_);
      }

      // Runs the tests only if there was no fatal failure or skip triggered
      // during global set-up.
      if (Test::IsSkipped()) {
        // Emit diagnostics when global set-up calls skip, as it will not be
        // emitted by default.
        TestResult& test_result =
            *internal::GetUnitTestImpl()->current_test_result();
        for (int j = 0; j < test_result.total_part_count(); ++j) {
          const TestPartResult& test_part_result =
              test_result.GetTestPartResult(j);
          if (test_part_result.type() == TestPartResult::kSkip) {
            const std::string& result = test_part_result.message();
            printf("%s\n", result.c_str());
          }
        }
        fflush(stdout);
      } else if (!Test::HasFatalFailure()) {
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Run();
          if (GTEST_FLAG_GET(fail_fast) &&
              GetMutableSuiteCase(test_index)->Failed()) {
            for (int j = test_index + 1; j < total_test_suite_count(); j++) {
              GetMutableSuiteCase(j)->Skip();
            }
            break;
          }
        }
      } else if (Test::HasFatalFailure()) {
        // If there was a fatal failure during the global setup then we know we
        // aren't going to run any tests. Explicitly mark all of the tests as
        // skipped to make this obvious in the output.
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Skip();
        }
      }

      // Tears down all environments in reverse order afterwards. If test
      // environments aren't recreated for each iteration, only do so on the
      // last iteration.
      if (i == repeat - 1 || recreate_environments_when_repeating) {
        repeater->OnEnvironmentsTearDownStart(*parent_);
        std::for_each(environments_.rbegin(), environments_.rend(),
                      TearDownEnvironment);
        repeater->OnEnvironmentsTearDownEnd(*parent_);
      }
    }

    elapsed_time_ = timer.Elapsed();

    // Tells the unit test event listener that the tests have just finished.
    repeater->OnTestIterationEnd(*parent_, i);

    // Gets the result and clears it.
    if (!Passed()) {
      failed = true;
    }

    // Restores the original test order after the iteration.  This
    // allows the user to quickly repro a failure that happens in the
    // N-th iteration without repeating the first (N - 1) iterations.
    // This is not enclosed in "if (GTEST_FLAG(shuffle)) { ... }", in
    // case the user somehow changes the value of the flag somewhere
    // (it's always safe to unshuffle the tests).
    UnshuffleTests();

    if (GTEST_FLAG_GET(shuffle)) {
      // Picks a new random seed for each iteration.
      random_seed_ = GetNextRandomSeed(random_seed_);
    }
  }

  repeater->OnTestProgramEnd(*parent_);
  // Destroy environments in normal code, not in static teardown.
  bool delete_environment_on_teardown = true;
  if (delete_environment_on_teardown) {
    ForEach(environments_, internal::Delete<Environment>);
    environments_.clear();
  }

  if (!gtest_is_initialized_before_run_all_tests) {
    ColoredPrintf(
        GTestColor::kRed,
        "\nIMPORTANT NOTICE - DO NOT IGNORE:\n"
        "This test program did NOT call " GTEST_INIT_GOOGLE_TEST_NAME_
        "() before calling RUN_ALL_TESTS(). This is INVALID. Soon " GTEST_NAME_
        " will start to enforce the valid usage. "
        "Please fix it ASAP, or IT WILL START TO FAIL.\n");  // NOLINT
  }

  return !failed;
}